

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generatecode.c
# Opt level: O1

void generate_c_code(ParsedOpcodeInfo *info,CCVariant *var,int m68kop,int synop,SymbolTable *sym,
                    char *operand_decls,char *postcode,OpcodeMappingInfo *map)

{
  ParsedOpcodeInfo *pPVar1;
  ParsedOpcodeInfo *pPVar2;
  BOOL BVar3;
  List *pLVar4;
  CCVariant *pCVar5;
  uint uVar6;
  ParsedOpcodeInfo *info_00;
  PatternRange *range;
  long lVar7;
  byte bVar8;
  uint uVar9;
  FILE *pFVar10;
  long lVar11;
  char cVar12;
  int iVar13;
  char *pcVar14;
  char *i;
  char *pcVar15;
  char (*pacVar16) [16];
  char buf3 [6];
  char buf4 [17];
  BOOL found;
  PatternRange ranges [32];
  char local_288a [5];
  undefined1 local_2885;
  char local_2884 [5];
  undefined1 local_287f;
  char local_287e [5];
  undefined1 local_2879;
  ParsedOpcodeInfo *local_2878;
  List *local_2870;
  ParsedOpcodeInfo *local_2868;
  CCVariant *local_2860;
  byte local_2858 [16];
  undefined1 local_2848;
  BOOL local_283c;
  PatternRange local_2838;
  PatternRange local_2830 [127];
  char local_2438 [4096];
  undefined1 auStack_1438 [5128];
  
  local_2868 = (ParsedOpcodeInfo *)CONCAT44(local_2868._4_4_,synop);
  local_2878 = (ParsedOpcodeInfo *)var;
  local_2870 = (List *)sym;
  local_2860 = (CCVariant *)operand_decls;
  pLVar4 = copy_list(var->code);
  c_postamble[0] = '\0';
  c_preamble[0] = '\0';
  iVar13 = 1;
  range = local_2830;
  do {
    BVar3 = pattern_range(info->opcode_bits,iVar13,range);
    pPVar1 = local_2878;
    iVar13 = iVar13 + 1;
    range = range + 1;
  } while (BVar3 != FALSE);
  rde_aux(pLVar4,&local_2838,m68kop,local_2878,(CCVariant *)sym,(int)operand_decls);
  lVar7 = 0;
  local_2870 = reduce(pLVar4,(SymbolTable *)local_2870,0);
  pcVar14 = info->name;
  lVar11 = *(long *)&pPVar1->cpu;
  uVar6 = 0x8000;
  do {
    if (*(char *)(lVar11 + lVar7) == '-') {
      bVar8 = 0x2d;
      if ((info->opcode_bits[lVar7] & 0xfeU) == 0x30) goto LAB_0010c767;
    }
    else {
LAB_0010c767:
      bVar8 = (uVar6 & m68kop) == 0 ^ 0x31;
    }
    local_2858[lVar7] = bVar8;
    lVar7 = lVar7 + 1;
    uVar6 = uVar6 >> 1;
  } while (lVar7 != 0x10);
  local_2848 = 0;
  uVar6 = *(uint *)&local_2878->name;
  uVar9 = 4;
  lVar11 = 0;
  do {
    if (((uVar6 & 0x1f) >> (uVar9 & 0x1f) & 1) == 0) {
      cVar12 = '-';
    }
    else {
      cVar12 = "-CNVXZ"[lVar11 + 1];
    }
    local_2884[lVar11] = cVar12;
    lVar11 = lVar11 + 1;
    uVar9 = uVar9 - 1;
  } while (lVar11 != 5);
  local_287f = 0;
  uVar9 = 4;
  lVar11 = 0;
  do {
    if (((uVar6 >> 5 & 0x1f) >> (uVar9 & 0x1f) & 1) == 0) {
      cVar12 = '-';
    }
    else {
      cVar12 = "-CNVXZ"[lVar11 + 1];
    }
    local_288a[lVar11] = cVar12;
    lVar11 = lVar11 + 1;
    uVar9 = uVar9 - 1;
  } while (lVar11 != 5);
  local_2885 = 0;
  uVar9 = 4;
  lVar11 = 0;
  do {
    if (((uVar6 >> 10 & 0x1f) >> (uVar9 & 0x1f) & 1) == 0) {
      cVar12 = '-';
    }
    else {
      cVar12 = "-CNVXZ"[lVar11 + 1];
    }
    local_287e[lVar11] = cVar12;
    lVar11 = lVar11 + 1;
    uVar9 = uVar9 - 1;
  } while (lVar11 != 5);
  local_2879 = 0;
  lVar7 = 0;
  fprintf((FILE *)syn68k_c_stream,"\n      /* %s %s ms:%s mns:%s needs:%s */\n",pcVar14,local_2858,
          local_2884,local_288a,local_287e);
  fprintf((FILE *)syn68k_c_stream,"      CASE (0x%04X)\n",(ulong)local_2868 & 0xffffffff);
  pLVar4 = local_2870;
  pcVar14 = info->name;
  lVar11 = *(long *)&local_2878->cpu;
  uVar6 = 0x8000;
  do {
    if (*(char *)(lVar11 + lVar7) == '-') {
      bVar8 = 0x2d;
      if ((info->opcode_bits[lVar7] & 0xfeU) == 0x30) goto LAB_0010c894;
    }
    else {
LAB_0010c894:
      bVar8 = (uVar6 & m68kop) == 0 ^ 0x31;
    }
    local_2858[lVar7] = bVar8;
    lVar7 = lVar7 + 1;
    uVar6 = uVar6 >> 1;
    if (lVar7 == 0x10) {
      local_2848 = 0;
      uVar6 = *(uint *)&local_2878->name;
      uVar9 = 4;
      lVar11 = 0;
      do {
        if (((uVar6 & 0x1f) >> (uVar9 & 0x1f) & 1) == 0) {
          cVar12 = '-';
        }
        else {
          cVar12 = "-CNVXZ"[lVar11 + 1];
        }
        local_2884[lVar11] = cVar12;
        lVar11 = lVar11 + 1;
        uVar9 = uVar9 - 1;
      } while (lVar11 != 5);
      local_287f = 0;
      uVar9 = 4;
      lVar11 = 0;
      do {
        if (((uVar6 >> 5 & 0x1f) >> (uVar9 & 0x1f) & 1) == 0) {
          cVar12 = '-';
        }
        else {
          cVar12 = "-CNVXZ"[lVar11 + 1];
        }
        local_288a[lVar11] = cVar12;
        lVar11 = lVar11 + 1;
        uVar9 = uVar9 - 1;
      } while (lVar11 != 5);
      local_2885 = 0;
      uVar9 = 4;
      lVar11 = 0;
      do {
        if (((uVar6 >> 10 & 0x1f) >> (uVar9 & 0x1f) & 1) == 0) {
          cVar12 = '-';
        }
        else {
          cVar12 = "-CNVXZ"[lVar11 + 1];
        }
        local_287e[lVar11] = cVar12;
        lVar11 = lVar11 + 1;
        uVar9 = uVar9 - 1;
      } while (lVar11 != 5);
      local_2879 = 0;
      local_2868 = info;
      fprintf((FILE *)syn68k_c_stream,
              "        CASE_PREAMBLE (\"%s\", \"%s\", \"%s\", \"%s\", \"%s\")\n",pcVar14,local_2858,
              local_2884,local_288a,local_287e);
      fputs((char *)local_2860,(FILE *)syn68k_c_stream);
      lVar11 = 0;
      do {
        auStack_1438[lVar11] = 0;
        *(undefined1 *)((long)&local_2838.index + lVar11) = 0;
        lVar11 = lVar11 + 0x400;
      } while (lVar11 != 0x1400);
      transform_rtvad_aux(pLVar4,pLVar4,(char (*) [5] [1024])&local_2838);
      lVar11 = 0x118d48;
      pcVar14 = local_2438;
      pCVar5 = (CCVariant *)0x0;
      do {
        lVar7 = 0;
        pcVar15 = pcVar14;
        local_2860 = pCVar5;
        do {
          if (*pcVar15 != '\0') {
            fprintf((FILE *)syn68k_c_stream,"        %s%s;\n",*(undefined8 *)(lVar11 + lVar7 * 8),
                    pcVar15);
          }
          lVar7 = lVar7 + 1;
          pcVar15 = pcVar15 + 0x400;
        } while (lVar7 != 4);
        pCVar5 = (CCVariant *)&local_2860->field_0x1;
        lVar11 = lVar11 + 0x28;
        pcVar14 = pcVar14 + 0x1400;
      } while (local_2860 == (CCVariant *)0x0);
      local_283c = FALSE;
      pCVar5 = local_2860;
      memset(&local_2838,0,0x200);
      pLVar4 = local_2870;
      gtd_aux(local_2870,(BOOL *)&local_2838,&local_283c);
      if (local_283c != FALSE) {
        fputs(";\n",(FILE *)syn68k_c_stream);
      }
      pPVar2 = local_2868;
      pPVar1 = local_2878;
      if ((pLVar4->token).type == TOK_LIST) {
        if (c_preamble[0] != '\0') {
          fprintf((FILE *)syn68k_c_stream,"        %s\n",c_preamble);
        }
        pFVar10 = syn68k_c_stream;
        fputs("        ",(FILE *)syn68k_c_stream);
        generate_code_for_list(pLVar4,(int)pFVar10,info_00,pCVar5);
        fputs(";\n",(FILE *)syn68k_c_stream);
        if (c_postamble[0] != '\0') {
          fprintf((FILE *)syn68k_c_stream,"        %s\n",c_postamble);
        }
        lVar11 = 4;
        pacVar16 = generate_c_code::cc_name;
        do {
          uVar6 = *(uint *)&pPVar1->name;
          if ((1 << ((byte)lVar11 & 0x1f) & uVar6 >> 0xf & 0x1e) != 0) {
            fprintf((FILE *)syn68k_c_stream,"        %s = %d;\n",pacVar16,
                    (ulong)(((uVar6 >> 0x14 & 0x1f) >> ((uint)lVar11 & 0x1f) & 1) != 0));
          }
          pacVar16 = pacVar16 + 1;
          lVar11 = lVar11 + -1;
        } while (lVar11 != 0);
        uVar6 = *(uint *)&pPVar1->name;
        if ((short)uVar6 < 0) {
          fprintf((FILE *)syn68k_c_stream,"        %s = %d;\n",0x112d40,
                  (ulong)((uVar6 >> 0x14 & 1) == 0));
        }
        if ((postcode != (char *)0x0) && (*postcode != '\0')) {
          fprintf((FILE *)syn68k_c_stream,"        %s\n");
        }
        iVar13 = synthetic_opcode_size(map);
        if (pPVar2->ends_block == FALSE) {
          fprintf((FILE *)syn68k_c_stream,"        CASE_POSTAMBLE (ROUND_UP (%d))\n",
                  (ulong)(uint)(iVar13 + pPVar2->operand_words_to_skip));
        }
        else {
          fputs("\n#ifdef PROFILE\n       profile_block (hash_lookup (READUL_US ((unsigned long)code - 4)));\n#endif\n"
                ,(FILE *)syn68k_c_stream);
          fwrite("#if SIZEOF_CHAR_P != 8\n\t    CHECK_FOR_INTERRUPT (READUL (US_TO_SYN68K (code - PTR_WORDS)));\n#else\n\t    CHECK_FOR_INTERRUPT (READUL_US (code - PTR_WORDS));\n#endif\n"
                 ,0xa2,1,(FILE *)syn68k_c_stream);
          fwrite("        CASE_POSTAMBLE (ROUND_UP (PTR_WORDS))\n",0x2e,1,(FILE *)syn68k_c_stream);
        }
      }
      else {
        parse_error(pLVar4,"Expecting code description list!\n");
      }
      return;
    }
  } while( true );
}

Assistant:

void
generate_c_code (const ParsedOpcodeInfo *info, const CCVariant *var,
		 int m68kop, int synop, SymbolTable *sym,
		 const char *operand_decls, const char *postcode,
		 const OpcodeMappingInfo *map)
{
  static const char cc_name[][16] = { "cpu_state.ccc", "cpu_state.ccn",
					"cpu_state.ccv", "cpu_state.ccx",
					"cpu_state.ccnz" };
  char buf1[6], buf2[6], buf3[6], buf4[17];
  int opcw;
  List *code = copy_list (var->code);
  int i;

  /* Clear out preamble and postamble. */
  c_preamble[0] = c_postamble[0] = '\0';

  /* Replace $ elements with appropriate things. */
  code = replace_dollar_elements (code, m68kop, info, var);

  /* Simplify the resulting code. */
  code = reduce (code, sym, 0);

  /* Output human-readable comment describing this synthetic opcode. */
  fprintf (syn68k_c_stream,
	   "\n      /* %s %s ms:%s mns:%s needs:%s */\n",
	   info->name, opcode_bits_string (m68kop, info, var, buf4),
	   cc_bits_string (var->cc_may_set, buf1),
	   cc_bits_string (var->cc_may_not_set, buf2),
	   cc_bits_string (var->cc_needed, buf3));

  /* Output case. */
  fprintf (syn68k_c_stream, "      CASE (0x%04X)\n", (unsigned) synop);
  fprintf (syn68k_c_stream, "        CASE_PREAMBLE (\"%s\", \"%s\", \"%s\", "
	   "\"%s\", \"%s\")\n",
	   info->name, opcode_bits_string (m68kop, info, var, buf4),
	   cc_bits_string (var->cc_may_set, buf1),
	   cc_bits_string (var->cc_may_not_set, buf2),
	   cc_bits_string (var->cc_needed, buf3));

  /* Output operand declarations. */
  fputs (operand_decls, syn68k_c_stream);

  /* Transform temp variables only used as one type to temp_variables,
   * and output decls for those variables.
   */
  transform_reg_to_var_and_decl (code);

  /* Output temp variable declarations. */
  generate_temp_decls (code);

  if (code->token.type != TOK_LIST)
    {
      parse_error (code, "Expecting code description list!\n");
      return;
    }

  /* Output preamble. */
  if (c_preamble[0] != '\0')
    fprintf (syn68k_c_stream, "        %s\n", c_preamble);
  
  /* Generate the code they specified. */
  fputs ("        ", syn68k_c_stream);
  generate_code_for_list (code, m68kop, info, var);
  fputs (";\n", syn68k_c_stream);
  
  /* Output postamble. */
  if (c_postamble[0] != '\0')
    fprintf (syn68k_c_stream, "        %s\n", c_postamble);
  
  /* Set any cc bits to 0 or 1 that are explicitly mentioned in the
   * cc variant description.  This saves the user some work generating
   * the 68k description file and reduces the chance of error.
   */
  for (i = 0; i < 4; i++)
    if ((var->cc_to_known_value >> (4 - i)) & 1)
      fprintf (syn68k_c_stream, "        %s = %d;\n", cc_name[i],
	       (var->cc_known_values >> (4 - i)) & 1);
  if (var->cc_to_known_value & 1)   /* Invert sense of Z bit. */
    fprintf (syn68k_c_stream, "        %s = %d;\n", cc_name[4],
	     !(var->cc_known_values & 1));

  if (postcode != NULL && postcode[0] != '\0')
    fprintf (syn68k_c_stream, "        %s\n", postcode);

  /* Count opcode words. */
  opcw = synthetic_opcode_size (map) + info->operand_words_to_skip;

  /* Only adjust code ptr if we didn't just end a block. */
  if (!info->ends_block)
    {
      /* Always increment enough so that the next opcode is guaranteed
       * to be a properly aligned pointer.
       */
      fprintf (syn68k_c_stream, "        CASE_POSTAMBLE (ROUND_UP (%d))\n",
	       (int) opcw);
    }

  else    /* If we end a block, profile the next block. */
    {
#if SIZEOF_CHAR_P != 8
      fputs ("\n#ifdef PROFILE\n"
	     "       profile_block (hash_lookup "
	     "(READUL (US_TO_SYN68K (code) - 4)));\n"
	     "#endif\n",
	     syn68k_c_stream);
#else
      fputs ("\n#ifdef PROFILE\n"
	     "       profile_block (hash_lookup "
	     "(READUL_US ((unsigned long)code - 4)));\n"
	     "#endif\n",
	     syn68k_c_stream);
#endif

#if defined (SYNCHRONOUS_INTERRUPTS) && !defined (GENERATE_NATIVE_CODE)
      fprintf (syn68k_c_stream,
"#if SIZEOF_CHAR_P != 8\n"
"	    CHECK_FOR_INTERRUPT (READUL (US_TO_SYN68K (code - PTR_WORDS)));\n"
"#else\n"
"	    CHECK_FOR_INTERRUPT (READUL_US (code - PTR_WORDS));\n"
"#endif\n");
#endif
      fprintf (syn68k_c_stream, "        CASE_POSTAMBLE "
	       "(ROUND_UP (PTR_WORDS))\n");
    }
  /* Done with this instruction. */
}